

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O1

void __thiscall sender::main(sender *this,string *url)

{
  int iVar1;
  intrusive_ptr<cppcms::application> iVar2;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  application *tmp;
  context *pcVar7;
  src_prop *psVar8;
  ostream *poVar9;
  long *plVar10;
  pools *ppVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar12;
  intrusive_ptr<cppcms::application> app;
  shared_ptr<cppcms::http::context> ctx;
  intrusive_ptr<cppcms::application> local_98;
  intrusive_ptr<cppcms::application> local_90 [2];
  application local_80 [16];
  intrusive_ptr<cppcms::application> local_70;
  intrusive_ptr<cppcms::application> local_68;
  undefined1 *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [16];
  service *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar5 = std::__cxx11::string::compare((char *)url);
  if (iVar5 == 0) {
    psVar8 = (src_prop *)operator_new(3);
    psVar8->src_async = false;
    psVar8->src_created = false;
    psVar8->src_to_app = false;
    pcVar7 = (context *)cppcms::application::context();
    cppcms::http::context::reset_specific<sender::src_prop>(pcVar7,psVar8);
    cppcms::application::request();
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"to_app","");
    cppcms::http::request::get((string *)local_90);
    iVar5 = std::__cxx11::string::compare((char *)local_90);
    if (local_90[0].p_ != local_80) {
      operator_delete(local_90[0].p_);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    psVar8->src_to_app = iVar5 == 0;
    bVar4 = (bool)cppcms::application::is_asynchronous();
    psVar8->src_async = bVar4;
    psVar8->src_created = false;
    cppcms::application::request();
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"to","");
    cppcms::http::request::get((string *)local_90);
    iVar6 = std::__cxx11::string::compare((char *)local_90);
    if (local_90[0].p_ != local_80) {
      operator_delete(local_90[0].p_);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    ppVar11 = this->pools_;
    if (iVar6 == 0) {
      this_00 = (ppVar11->sync).
                super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = this_00->_M_use_count;
        do {
          if (iVar6 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar4 = iVar6 == iVar1;
          if (bVar4) {
            this_00->_M_use_count = iVar6 + 1;
            iVar1 = iVar6;
          }
          iVar6 = iVar1;
          UNLOCK();
        } while (!bVar4);
      }
    }
    else {
      this_00 = (ppVar11->async).
                super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = this_00->_M_use_count;
        do {
          if (iVar6 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar4 = iVar6 == iVar1;
          if (bVar4) {
            this_00->_M_use_count = iVar6 + 1;
            iVar1 = iVar6;
          }
          iVar6 = iVar1;
          UNLOCK();
        } while (!bVar4);
      }
      ppVar11 = (pools *)&ppVar11->async;
    }
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = this_00->_M_use_count == 0;
    }
    if (bVar4) {
      peVar12 = (element_type *)0x0;
    }
    else {
      peVar12 = (ppVar11->sync).
                super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    cppcms::application::release_context();
    puVar3 = local_60;
    if (peVar12 == (element_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FAIL: tgt in line: ",0x13);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xfa);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      g_fail = 1;
    }
    else if (iVar5 == 0) {
      local_98.p_ = (application *)0x0;
      cppcms::application::service();
      cppcms::service::get_io_service();
      cppcms::application_specific_pool::asynchronous_application_by_io_service
                ((io_service *)&local_68);
      iVar2.p_ = local_68.p_;
      local_68.p_ = (application *)0x0;
      local_90[0].p_ = local_98.p_;
      local_98.p_ = iVar2.p_;
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(local_90);
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_68);
      if (local_98.p_ == (application *)0x0) {
        cppcms::application::service();
        cppcms::service::get_io_service();
        cppcms::application::service();
        cppcms::application_specific_pool::asynchronous_application_by_io_service
                  ((io_service *)&local_68,(service *)peVar12);
        iVar2.p_ = local_68.p_;
        local_68.p_ = (application *)0x0;
        local_90[0].p_ = local_98.p_;
        local_98.p_ = iVar2.p_;
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(local_90);
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_68);
        psVar8->src_created = true;
      }
      puVar3 = local_60;
      if (local_98.p_ == (application *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"FAIL: app in line: ",0x13);
        plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x107);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        g_fail = 1;
      }
      else {
        local_70.p_ = local_98.p_;
        booster::intrusive_ptr_add_ref(local_98.p_);
        local_90[0].p_ = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/app","");
        cppcms::http::context::submit_to_asynchronous_application(puVar3,&local_70,local_90);
        if (local_90[0].p_ != local_80) {
          operator_delete(local_90[0].p_);
        }
        booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_70);
      }
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_98);
    }
    else {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_90[0].p_ = local_80;
      local_40 = (service *)peVar12;
      local_38 = this_00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/pool","");
      cppcms::http::context::submit_to_pool(puVar3,&local_40,local_90);
      if (local_90[0].p_ != local_80) {
        operator_delete(local_90[0].p_);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    pcVar7 = (context *)cppcms::application::context();
    psVar8 = cppcms::http::context::get_specific<sender::src_prop>(pcVar7);
    if (psVar8 != (src_prop *)0x0) {
      cppcms::application::response();
      poVar9 = (ostream *)cppcms::http::response::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"async=",6);
      cppcms::application::is_asynchronous();
      poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nsrc_async=",0xb);
      poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nsrc_created=",0xd);
      poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nsrc_to_app=",0xc);
      poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\npath=",6);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(url->_M_dataplus)._M_p,url->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FAIL: p in line: ",0x11);
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xe2);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    g_fail = 1;
  }
  return;
}

Assistant:

void main(std::string url)
	{
		if(url!="/sender") {
			src_prop *p = context().get_specific<src_prop>();
			TESTNT(p);
			response().out() << "async=" << is_asynchronous() << "\n"
			"src_async="  << p->src_async   <<"\n"
			"src_created="<< p->src_created <<"\n"
			"src_to_app=" << p->src_to_app  <<"\n"
			"path="       << url<<"\n"
			;
			return;
		}

		src_prop *p=new src_prop();
		context().reset_specific<src_prop>(p);
		
		bool to_app = request().get("to_app")=="1";
		p->src_to_app = to_app;
		p->src_async = is_asynchronous();
		p->src_created = false;
		booster::shared_ptr<cppcms::application_specific_pool> tgt;
		if(request().get("to")=="sync") 
			tgt = pools_->sync.lock();
		else 
			tgt = pools_->async.lock();

		booster::shared_ptr<cppcms::http::context> ctx = release_context();
		TESTNT(tgt);
		
		if(!to_app) {
			ctx->submit_to_pool(tgt,"/pool");
			return; 
		}
		
		booster::intrusive_ptr<cppcms::application> app;
		app =tgt->asynchronous_application_by_io_service(service().get_io_service());
		if(!app) {
			app = tgt->asynchronous_application_by_io_service(service().get_io_service(),service());
			p->src_created=true;
		}
		TESTNT(app);
		ctx->submit_to_asynchronous_application(app,"/app");
	}